

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Segment::ParseCues(Segment *this,longlong off,longlong *pos,long *len)

{
  long element_start_00;
  int iVar1;
  longlong lVar2;
  long lVar3;
  Cues *this_00;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  Segment *in_RDI;
  longlong element_size;
  longlong element_stop;
  longlong size;
  longlong id;
  longlong idpos;
  longlong result;
  longlong segment_stop;
  longlong element_start;
  int status;
  longlong avail;
  longlong total;
  long *in_stack_ffffffffffffff48;
  Cues *pCVar4;
  long pos_00;
  longlong in_stack_ffffffffffffff60;
  IMkvReader *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  IMkvReader *in_stack_ffffffffffffff78;
  long local_38;
  long local_30;
  long *local_28;
  long *local_20;
  long local_18;
  long local_8;
  
  if (in_RDI->m_pCues == (Cues *)0x0) {
    if (in_RSI < 0) {
      local_8 = -1;
    }
    else {
      local_28 = in_RCX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      iVar1 = (*in_RDI->m_pReader->_vptr_IMkvReader[1])(in_RDI->m_pReader,&local_30,&local_38);
      if (iVar1 < 0) {
        local_8 = (long)iVar1;
      }
      else {
        *local_20 = in_RDI->m_start + local_18;
        if ((local_30 < 0) || (local_30 <= *local_20)) {
          local_8 = 1;
        }
        else {
          element_start_00 = *local_20;
          if (in_RDI->m_size < 0) {
            pos_00 = -1;
          }
          else {
            pos_00 = in_RDI->m_start + in_RDI->m_size;
          }
          if (local_38 < *local_20 + 1) {
            *local_28 = 1;
            local_8 = -3;
          }
          else {
            lVar3 = pos_00;
            local_8 = GetUIntLength((IMkvReader *)in_RDI,pos_00,in_stack_ffffffffffffff48);
            if (-1 < local_8) {
              if (local_8 < 1) {
                if ((pos_00 < 0) || (*local_20 + *local_28 <= pos_00)) {
                  if (local_38 < *local_20 + *local_28) {
                    local_8 = -3;
                  }
                  else {
                    lVar2 = ReadID(in_stack_ffffffffffffff78,
                                   CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                                   (long *)in_stack_ffffffffffffff68);
                    if (lVar2 == 0x1c53bb6b) {
                      *local_20 = *local_28 + *local_20;
                      if (local_38 < *local_20 + 1) {
                        *local_28 = 1;
                        local_8 = -3;
                      }
                      else {
                        local_8 = GetUIntLength((IMkvReader *)in_RDI,lVar3,in_stack_ffffffffffffff48
                                               );
                        if (-1 < local_8) {
                          if (local_8 < 1) {
                            if ((pos_00 < 0) || (*local_20 + *local_28 <= pos_00)) {
                              if (local_38 < *local_20 + *local_28) {
                                local_8 = -3;
                              }
                              else {
                                local_8 = ReadUInt(in_stack_ffffffffffffff68,
                                                   in_stack_ffffffffffffff60,(long *)in_RDI);
                                if (-1 < local_8) {
                                  if (local_8 == 0) {
                                    local_8 = 1;
                                  }
                                  else {
                                    *local_20 = *local_28 + *local_20;
                                    lVar3 = *local_20 + local_8;
                                    if ((pos_00 < 0) || (lVar3 <= pos_00)) {
                                      if ((local_30 < 0) || (lVar3 <= local_30)) {
                                        *local_28 = local_8;
                                        if (local_38 < lVar3) {
                                          local_8 = -3;
                                        }
                                        else {
                                          this_00 = (Cues *)operator_new(0x48,(nothrow_t *)
                                                                              &std::nothrow);
                                          pCVar4 = (Cues *)0x0;
                                          if (this_00 != (Cues *)0x0) {
                                            Cues::Cues(this_00,in_RDI,*local_20,local_8,
                                                       element_start_00,lVar3 - element_start_00);
                                            pCVar4 = this_00;
                                          }
                                          in_RDI->m_pCues = pCVar4;
                                          if (in_RDI->m_pCues == (Cues *)0x0) {
                                            local_8 = -1;
                                          }
                                          else {
                                            local_8 = 0;
                                          }
                                        }
                                      }
                                      else {
                                        local_8 = 1;
                                      }
                                    }
                                    else {
                                      local_8 = -2;
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              local_8 = -2;
                            }
                          }
                          else {
                            *local_28 = 1;
                            local_8 = -3;
                          }
                        }
                      }
                    }
                    else {
                      local_8 = -2;
                    }
                  }
                }
                else {
                  local_8 = -2;
                }
              }
              else {
                *local_28 = 1;
                local_8 = -3;
              }
            }
          }
        }
      }
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

long Segment::ParseCues(long long off, long long& pos, long& len) {
  if (m_pCues)
    return 0;  // success

  if (off < 0)
    return -1;

  long long total, avail;

  const int status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  pos = m_start + off;

  if ((total < 0) || (pos >= total))
    return 1;  // don't bother parsing cues

  const long long element_start = pos;
  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  long long result = GetUIntLength(m_pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)  // underflow (weird)
  {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  if ((segment_stop >= 0) && ((pos + len) > segment_stop))
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long idpos = pos;

  const long long id = ReadID(m_pReader, idpos, len);

  if (id != libwebm::kMkvCues)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume ID
  assert((segment_stop < 0) || (pos <= segment_stop));

  // Read Size

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  result = GetUIntLength(m_pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)  // underflow (weird)
  {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  if ((segment_stop >= 0) && ((pos + len) > segment_stop))
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long size = ReadUInt(m_pReader, pos, len);

  if (size < 0)  // error
    return static_cast<long>(size);

  if (size == 0)  // weird, although technically not illegal
    return 1;  // done

  pos += len;  // consume length of size of element
  assert((segment_stop < 0) || (pos <= segment_stop));

  // Pos now points to start of payload

  const long long element_stop = pos + size;

  if ((segment_stop >= 0) && (element_stop > segment_stop))
    return E_FILE_FORMAT_INVALID;

  if ((total >= 0) && (element_stop > total))
    return 1;  // don't bother parsing anymore

  len = static_cast<long>(size);

  if (element_stop > avail)
    return E_BUFFER_NOT_FULL;

  const long long element_size = element_stop - element_start;

  m_pCues =
      new (std::nothrow) Cues(this, pos, size, element_start, element_size);
  if (m_pCues == NULL)
    return -1;

  return 0;  // success
}